

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSort.c
# Opt level: O0

void Msat_SolverSort(Msat_Clause_t **array,int size,double seed)

{
  Msat_Clause_t *pC;
  Msat_Clause_t *pMVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  int local_38;
  int local_34;
  int j;
  int i;
  Msat_Clause_t *tmp;
  Msat_Clause_t *pivot;
  double seed_local;
  int size_local;
  Msat_Clause_t **array_local;
  
  if (size < 0x10) {
    Msat_SolverSortSelection(array,size);
  }
  else {
    iVar2 = irand(seed,size);
    pC = array[iVar2];
    local_34 = -1;
    local_38 = size;
    while( true ) {
      do {
        local_34 = local_34 + 1;
        fVar3 = Msat_ClauseReadActivity(array[local_34]);
        fVar4 = Msat_ClauseReadActivity(pC);
      } while (fVar3 < fVar4);
      do {
        local_38 = local_38 + -1;
        fVar3 = Msat_ClauseReadActivity(pC);
        fVar4 = Msat_ClauseReadActivity(array[local_38]);
      } while (fVar3 < fVar4);
      if (local_38 <= local_34) break;
      pMVar1 = array[local_34];
      array[local_34] = array[local_38];
      array[local_38] = pMVar1;
    }
    Msat_SolverSort(array,local_34,seed);
    Msat_SolverSort(array + local_34,size - local_34,seed);
  }
  return;
}

Assistant:

void Msat_SolverSort( Msat_Clause_t ** array, int size, double seed )
{
    if (size <= 15)
        Msat_SolverSortSelection( array, size );
    else
    {
        Msat_Clause_t *   pivot = array[irand(seed, size)];
        Msat_Clause_t *   tmp;
        int              i = -1;
        int              j = size;

        for(;;)
        {
            do i++; while( Msat_ClauseReadActivity(array[i]) < Msat_ClauseReadActivity(pivot) );
            do j--; while( Msat_ClauseReadActivity(pivot) < Msat_ClauseReadActivity(array[j]) );

            if ( i >= j ) break;

            tmp = array[i]; array[i] = array[j]; array[j] = tmp;
        }
        Msat_SolverSort(array    , i     , seed);
        Msat_SolverSort(&array[i], size-i, seed);
    }
}